

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuLaunchData.cpp
# Opt level: O1

bool __thiscall xmrig::CpuLaunchData::isEqual(CpuLaunchData *this,CpuLaunchData *other)

{
  short sVar1;
  short sVar2;
  
  sVar1._0_1_ = this->hugePages;
  sVar1._1_1_ = this->hwAES;
  sVar2._0_1_ = other->hugePages;
  sVar2._1_1_ = other->hwAES;
  if (((sVar1 == sVar2 && (this->assembly).m_id == (other->assembly).m_id) &&
      (this->intensity == other->intensity)) && (this->priority == other->priority)) {
    return this->affinity == other->affinity;
  }
  return false;
}

Assistant:

bool xmrig::CpuLaunchData::isEqual(const CpuLaunchData &other) const
{
    return (assembly            == other.assembly
            && hugePages        == other.hugePages
            && hwAES            == other.hwAES
            && intensity        == other.intensity
            && priority         == other.priority
            && affinity         == other.affinity
            );
}